

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

void opj_read_bytes_LE(OPJ_BYTE *p_buffer,OPJ_UINT32 *p_value,OPJ_UINT32 p_nb_bytes)

{
  OPJ_UINT32 i;
  OPJ_BYTE *l_data_ptr;
  OPJ_UINT32 p_nb_bytes_local;
  OPJ_UINT32 *p_value_local;
  OPJ_BYTE *p_buffer_local;
  
  l_data_ptr = (OPJ_BYTE *)((long)p_value + (ulong)p_nb_bytes);
  *p_value = 0;
  p_buffer_local = p_buffer;
  for (i = 0; l_data_ptr = l_data_ptr + -1, i < p_nb_bytes; i = i + 1) {
    *l_data_ptr = *p_buffer_local;
    p_buffer_local = p_buffer_local + 1;
  }
  return;
}

Assistant:

void opj_read_bytes_LE(const OPJ_BYTE * p_buffer, OPJ_UINT32 * p_value, OPJ_UINT32 p_nb_bytes)
{
	OPJ_BYTE * l_data_ptr = ((OPJ_BYTE *) p_value) + p_nb_bytes-1;
	OPJ_UINT32 i;

	assert(p_nb_bytes > 0 && p_nb_bytes <= sizeof(OPJ_UINT32));

	*p_value = 0;
	for (i=0;i<p_nb_bytes;++i) {
		*(l_data_ptr--) = *(p_buffer++);
	}
}